

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Enumerant::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  ArrayPtr<const_char> AVar1;
  IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
  local_110;
  Reader local_100;
  undefined1 local_d0 [16];
  CapTableReader *pCStack_c0;
  void *local_b8;
  WirePointer *pWStack_b0;
  StructDataBitCount local_a8;
  StructPointerCount SStack_a4;
  undefined2 uStack_a2;
  int iStack_a0;
  undefined4 uStack_9c;
  Reader local_98;
  Reader local_58;
  
  local_98._reader.dataSize = proto._reader.dataSize;
  local_98._reader.pointerCount = proto._reader.pointerCount;
  local_98._reader._38_2_ = proto._reader._38_2_;
  local_98._reader.nestingLimit = proto._reader.nestingLimit;
  local_98._reader._44_4_ = proto._reader._44_4_;
  local_98._reader.data = proto._reader.data;
  local_98._reader.pointers = proto._reader.pointers;
  local_98._reader.segment = proto._reader.segment;
  local_98._reader.capTable = proto._reader.capTable;
  capnp::schema::Enumerant::Reader::getAnnotations((Reader *)local_d0,&local_98);
  local_110.index = 0;
  local_110.container = (Reader *)local_d0;
  while( true ) {
    if (local_110.index == (ListElementCount)local_b8) {
      AVar1 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&proto);
      return (StringPtr)AVar1;
    }
    _::
    IndexingIterator<const_capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>::Reader,_capnp::schema::Annotation::Reader>
    ::operator*(&local_100,&local_110);
    if ((0x3f < local_100._reader.dataSize) && (*local_100._reader.data == -0xd9b5886010e6e32))
    break;
    local_110.index = local_110.index + 1;
  }
  capnp::schema::Annotation::Reader::getValue(&local_58,&local_100);
  local_d0[0] = 1;
  local_d0._8_8_ = local_58._reader.segment;
  pCStack_c0 = local_58._reader.capTable;
  local_b8 = local_58._reader.data;
  pWStack_b0 = local_58._reader.pointers;
  local_a8 = local_58._reader.dataSize;
  SStack_a4 = local_58._reader.pointerCount;
  uStack_a2 = local_58._reader._38_2_;
  iStack_a0 = local_58._reader.nestingLimit;
  uStack_9c = local_58._reader._44_4_;
  AVar1 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText((Reader *)(local_d0 + 8));
  return (StringPtr)AVar1;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_MAYBE(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name->getText();
    } else {
      return proto.getName();
    }
  }